

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::selectWordAtPos(QWidgetLineControl *this,int cursor)

{
  long lVar1;
  bool bVar2;
  CursorMode pos;
  int iVar3;
  QChar *pQVar4;
  int pos_00;
  int iVar5;
  long lVar6;
  
  iVar5 = (int)this + 0x118;
  pos = QTextLayout::previousCursorPosition(iVar5,(uint)(cursor < *(int *)(this + 0x28)) + cursor);
  moveCursor(this,pos,false);
  iVar3 = QTextLayout::nextCursorPosition(iVar5,pos);
  lVar6 = (long)iVar3;
  iVar5 = cursor;
  if (iVar3 < cursor) {
    iVar5 = iVar3;
  }
  iVar3 = iVar3 + 1;
  lVar1 = lVar6 * 2;
  do {
    pos_00 = iVar5;
    if (lVar6 <= cursor) break;
    lVar6 = lVar6 + -1;
    pQVar4 = QString::data((QString *)(this + 0x18));
    bVar2 = QChar::isSpace((QChar *)((long)&pQVar4[-1].ucs + lVar1));
    iVar3 = iVar3 + -1;
    pos_00 = iVar3;
    lVar1 = lVar1 + -2;
  } while (bVar2);
  moveCursor(this,pos_00,true);
  return;
}

Assistant:

void QWidgetLineControl::selectWordAtPos(int cursor)
{
    int next = cursor + 1;
    if (next > end())
        --next;
    int c = textLayout()->previousCursorPosition(next, QTextLayout::SkipWords);
    moveCursor(c, false);
    // ## text layout should support end of words.
    int end = textLayout()->nextCursorPosition(c, QTextLayout::SkipWords);
    while (end > cursor && m_text[end-1].isSpace())
        --end;
    moveCursor(end, true);
}